

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDirectDemo_ls.c
# Opt level: O1

void PrintFinalStats(void *cvode_mem,int miter,sunrealtype ero)

{
  uint uVar1;
  char *pcVar2;
  long nfeLS;
  long nje;
  long nsetups;
  long leniwLS;
  long lenrwLS;
  long netf;
  long ncfn;
  long nni;
  long nfe;
  long nst;
  long leniw;
  long lenrw;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  sunrealtype local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_50 = ero;
  uVar1 = CVodeGetWorkSpace(cvode_mem,&local_18,&local_20);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetWorkSpace",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumSteps(cvode_mem,&local_28);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumSteps",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumRhsEvals(cvode_mem,&local_30);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumRhsEvals",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumLinSolvSetups(cvode_mem,&local_68);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumLinSolvSetups",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumErrTestFails(cvode_mem,&local_48);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumErrTestFails",
            (ulong)uVar1);
  }
  uVar1 = CVodeGetNumNonlinSolvIters(cvode_mem,&local_38);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
            "CVodeGetNumNonlinSolvIters",(ulong)uVar1);
  }
  uVar1 = CVodeGetNumNonlinSolvConvFails(cvode_mem,&local_40);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
            "CVodeGetNumNonlinSolvConvFails",(ulong)uVar1);
  }
  puts("\n Final statistics for this run:\n");
  printf(" CVode real workspace length              = %4ld \n",local_18);
  printf(" CVode integer workspace length           = %4ld \n",local_20);
  printf(" Number of steps                          = %4ld \n",local_28);
  printf(" Number of f-s                            = %4ld \n",local_30);
  printf(" Number of setups                         = %4ld \n",local_68);
  printf(" Number of nonlinear iterations           = %4ld \n",local_38);
  printf(" Number of nonlinear convergence failures = %4ld \n",local_40);
  printf(" Number of error test failures            = %4ld \n\n",local_48);
  if (miter == 0) goto LAB_00103a9e;
  if (miter == 3) {
    local_70 = local_68;
    uVar1 = CVDiagGetNumRhsEvals(cvode_mem,&local_78);
    if ((int)uVar1 < 0) {
      fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVDiagGetNumRhsEvals",
              (ulong)uVar1);
    }
    uVar1 = CVDiagGetWorkSpace(cvode_mem,&local_58,&local_60);
    if ((int)uVar1 < 0) {
      pcVar2 = "CVDiagGetWorkSpace";
LAB_00103c4d:
      fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar2,(ulong)uVar1);
    }
  }
  else {
    uVar1 = CVodeGetNumJacEvals(cvode_mem,&local_70);
    if ((int)uVar1 < 0) {
      fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumJacEvals",
              (ulong)uVar1);
    }
    uVar1 = CVodeGetNumLinRhsEvals(cvode_mem,&local_78);
    if ((int)uVar1 < 0) {
      fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetNumLinRhsEvals",
              (ulong)uVar1);
    }
    uVar1 = CVodeGetLinWorkSpace(cvode_mem,&local_58,&local_60);
    if ((int)uVar1 < 0) {
      pcVar2 = "CVodeGetLinWorkSpace";
      goto LAB_00103c4d;
    }
  }
  printf(" Linear solver real workspace length      = %4ld \n",local_58);
  printf(" Linear solver integer workspace length   = %4ld \n",local_60);
  printf(" Number of Jacobian evaluations           = %4ld \n",local_70);
  printf(" Number of f evals. in linear solver      = %4ld \n\n",local_78);
LAB_00103a9e:
  printf(" Error overrun = %.3f \n",local_50);
  return;
}

Assistant:

static void PrintFinalStats(void* cvode_mem, int miter, sunrealtype ero)
{
  long int lenrw, leniw, lenrwLS, leniwLS;
  long int nst, nfe, nsetups, nni, ncfn, netf, nje, nfeLS;
  int retval;

  retval = CVodeGetWorkSpace(cvode_mem, &lenrw, &leniw);
  check_retval(&retval, "CVodeGetWorkSpace", 1);
  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(&retval, "CVodeGetNumRhsEvals", 1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(&retval, "CVodeGetNumLinSolvSetups", 1);
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(&retval, "CVodeGetNumErrTestFails", 1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(&retval, "CVodeGetNumNonlinSolvIters", 1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1);

  printf("\n Final statistics for this run:\n\n");
  printf(" CVode real workspace length              = %4ld \n", lenrw);
  printf(" CVode integer workspace length           = %4ld \n", leniw);
  printf(" Number of steps                          = %4ld \n", nst);
  printf(" Number of f-s                            = %4ld \n", nfe);
  printf(" Number of setups                         = %4ld \n", nsetups);
  printf(" Number of nonlinear iterations           = %4ld \n", nni);
  printf(" Number of nonlinear convergence failures = %4ld \n", ncfn);
  printf(" Number of error test failures            = %4ld \n\n", netf);

  if (miter != FUNC)
  {
    if (miter != DIAG)
    {
      retval = CVodeGetNumJacEvals(cvode_mem, &nje);
      check_retval(&retval, "CVodeGetNumJacEvals", 1);
      retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
      check_retval(&retval, "CVodeGetNumLinRhsEvals", 1);
      retval = CVodeGetLinWorkSpace(cvode_mem, &lenrwLS, &leniwLS);
      check_retval(&retval, "CVodeGetLinWorkSpace", 1);
    }
    else
    {
      nje    = nsetups;
      retval = CVDiagGetNumRhsEvals(cvode_mem, &nfeLS);
      check_retval(&retval, "CVDiagGetNumRhsEvals", 1);
      retval = CVDiagGetWorkSpace(cvode_mem, &lenrwLS, &leniwLS);
      check_retval(&retval, "CVDiagGetWorkSpace", 1);
    }
    printf(" Linear solver real workspace length      = %4ld \n", lenrwLS);
    printf(" Linear solver integer workspace length   = %4ld \n", leniwLS);
    printf(" Number of Jacobian evaluations           = %4ld \n", nje);
    printf(" Number of f evals. in linear solver      = %4ld \n\n", nfeLS);
  }

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf(" Error overrun = %.3Lf \n", ero);
#else
  printf(" Error overrun = %.3f \n", ero);
#endif
}